

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O0

MPP_RET mpp_enc_refs_get_cpb(MppEncRefs refs,EncCpbStatus *status)

{
  int iVar1;
  int seq_idx;
  MppEncRefCfgImpl *cfg_00;
  ulong uVar2;
  MppEncRefStFrmCfg *pMVar3;
  bool bVar4;
  RK_S32 RVar5;
  uint *puVar6;
  EncFrmStatus *frm_00;
  EncFrmStatus *frm_01;
  EncFrmStatus *frm_02;
  bool bVar7;
  bool bVar8;
  bool local_89;
  char *local_88;
  RK_S32 cpb_idx;
  EncFrmStatus *ref_found;
  RK_S32 i;
  RK_S32 prev_frm_is_pass1;
  RK_S32 cleanup_cpb;
  RK_S32 set_to_lt;
  RefsCnt *lt_cfg;
  EncFrmStatus *ref;
  EncFrmStatus *frm;
  MppEncRefFrmUsrCfg *usr_cfg;
  MppEncRefStFrmCfg *st_cfg;
  EncVirtualCpb *cpb;
  MppEncRefCfgImpl *cfg;
  MppEncRefsImpl *p;
  EncCpbStatus *status_local;
  MppEncRefs refs_local;
  
  if (refs == (MppEncRefs)0x0) {
    _mpp_log_l(2,"mpp_enc_refs","invalid NULL input refs\n","mpp_enc_refs_get_cpb");
    refs_local._4_4_ = MPP_ERR_VALUE;
  }
  else {
    if ((enc_refs_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","enter %p\n","mpp_enc_refs_get_cpb",refs);
    }
    cfg_00 = *(MppEncRefCfgImpl **)((long)refs + 8);
    puVar6 = (uint *)((long)refs + 0x10);
    frm_00 = &status->curr;
    frm_01 = &status->refr;
    bVar4 = false;
    uVar2 = frm_00->val;
    bVar7 = (*refs & 4) != 0;
    if ((*(int *)((long)refs + 0x30) != 0) &&
       (*(int *)((long)refs + 0x30) <= *(int *)((long)refs + 0x5d4))) {
      bVar8 = *(int *)((long)refs + 0x34) == 0;
      if (!bVar8) {
        *(int *)((long)refs + 0x5d8) =
             *(int *)((long)refs + 0x5d4) / *(int *)((long)refs + 0x30) + 1;
      }
      bVar7 = bVar8 || bVar7;
    }
    if ((*puVar6 & 1) != 0) {
      *puVar6 = *puVar6 & 0xfffffffe;
      bVar7 = true;
      *(undefined4 *)((long)refs + 0x5d8) = 0;
    }
    if (bVar7) {
      cleanup_cpb_refs((EncVirtualCpb *)((long)refs + 0x40));
    }
    else if ((*refs & 1) != 0) {
      *(undefined4 *)((long)refs + 0x5dc) = 0;
      *(undefined4 *)((long)refs + 0x5e0) = 0;
    }
    *(undefined4 *)refs = 0;
    *(int *)((long)refs + 0x5d0) = *(int *)((long)refs + 0x5d0) + 1;
    RVar5 = get_cpb_st_cfg_pos((EncVirtualCpb *)((long)refs + 0x40),cfg_00);
    *(RK_S32 *)((long)refs + 0x5dc) = RVar5;
    pMVar3 = cfg_00->st_cfg;
    iVar1 = *(int *)((long)refs + 0x5dc);
    seq_idx = *(int *)((long)refs + 0x5d4);
    *(int *)((long)refs + 0x5d4) = seq_idx + 1;
    set_st_cfg_to_frm(frm_00,seq_idx,pMVar3 + iVar1);
    set_frm_refresh_flag(frm_00,(MppEncRefsImpl *)refs);
    _cleanup_cpb = (RefsCnt *)((long)refs + 0x360);
    for (ref_found._0_4_ = 0; (int)ref_found < cfg_00->lt_cfg_cnt;
        ref_found._0_4_ = (int)ref_found + 1) {
      if (_cleanup_cpb->delay_cnt == 0) {
        if ((!bVar4) && (_cleanup_cpb->cnt == 0)) {
          set_lt_cfg_to_frm(frm_00,_cleanup_cpb);
          bVar4 = true;
        }
        _cleanup_cpb->cnt = _cleanup_cpb->cnt + 1;
        if (_cleanup_cpb->len <= _cleanup_cpb->cnt) {
          if (_cleanup_cpb->len == 0) {
            _cleanup_cpb->cnt = 1;
            _cleanup_cpb->idx = 1;
          }
          else {
            _cleanup_cpb->cnt = 0;
            _cleanup_cpb->idx = _cleanup_cpb->idx + 1;
          }
        }
      }
      else {
        _cleanup_cpb->delay_cnt = _cleanup_cpb->delay_cnt + -1;
      }
      _cleanup_cpb = _cleanup_cpb + 1;
    }
    if ((*puVar6 & 4) != 0) {
      frm_00->val = frm_00->val & 0xffffffffffffffbf;
      frm_00->val = frm_00->val & 0xffffffffffffff7f | 0x80;
      frm_00->val = frm_00->val & 0xfffffffffffff0ff |
                    ((ulong)*(uint *)((long)refs + 0x20) & 0xf) << 8;
      if (((frm_00->val >> 5 & 1) != 0) && ((frm_00->val >> 8 & 0xf) != 0)) {
        frm_00->val = frm_00->val & 0xfffffffffffff0ff;
        _mpp_log_l(2,"mpp_enc_refs","can not set IDR to ltr with non-zero index\n",
                   "mpp_enc_refs_get_cpb");
      }
      frm_00->val = frm_00->val & 0xffffffffffff0fff;
      *(undefined4 *)((long)refs + 0x5e0) = 0;
      *(undefined4 *)((long)refs + 0x5dc) = 0;
      *puVar6 = *puVar6 & 0xfffffffb;
    }
    if ((*puVar6 & 8) != 0) {
      if (((*(int *)((long)refs + 0x24) < cfg_00->max_tlayers) && ((frm_00->val >> 5 & 1) == 0)) &&
         ((frm_00->val >> 7 & 1) == 0)) {
        frm_00->val = frm_00->val & 0xffffffffffff0fff |
                      ((ulong)*(uint *)((long)refs + 0x24) & 0xf) << 0xc;
      }
      else {
        if ((frm_00->val >> 5 & 1) == 0) {
          local_88 = "st";
          if ((frm_00->val >> 7 & 1) != 0) {
            local_88 = "LTR";
          }
        }
        else {
          local_88 = "IDR";
        }
        _mpp_log_l(2,"mpp_enc_refs","Invalid temporal_id %d, frm is %s\n","mpp_enc_refs_get_cpb",
                   (ulong)*(uint *)((long)refs + 0x24),local_88);
      }
      *puVar6 = *puVar6 & 0xfffffff7;
    }
    if ((*puVar6 & 0x10) != 0) {
      frm_00->val = frm_00->val & 0xffffffffffc0ffff |
                    ((ulong)*(uint *)((long)refs + 0x28) & 0x3f) << 0x10;
      frm_00->val = frm_00->val & 0xffffffffc03fffff |
                    ((ulong)*(uint *)((long)refs + 0x2c) & 0xff) << 0x16;
      *puVar6 = *puVar6 & 0xffffffef;
    }
    if ((*puVar6 & 0x40) != 0) {
      frm_00->val = frm_00->val & 0xffffffffffffffbf | 0x40;
      *puVar6 = *puVar6 & 0xffffffbf;
    }
    if ((*puVar6 & 0x20) != 0) {
      frm_00->val = frm_00->val & 0xffffffdfffffffff | 0x2000000000;
      *puVar6 = *puVar6 & 0xffffffdf;
    }
    local_89 = true;
    if ((frm_00->val >> 6 & 1) == 0) {
      local_89 = *(int *)((long)refs + 0x30) == 1;
    }
    frm_00->val = frm_00->val & 0xfffffffffffffffd | (ulong)local_89 << 1;
    *(int *)((long)refs + 0x5e0) = *(int *)((long)refs + 0x5e0) + 1;
    if (pMVar3[iVar1].repeat < *(int *)((long)refs + 0x5e0)) {
      *(undefined4 *)((long)refs + 0x5e0) = 0;
      *(int *)((long)refs + 0x5dc) = *(int *)((long)refs + 0x5dc) + 1;
    }
    frm_02 = get_ref_from_cpb((EncVirtualCpb *)((long)refs + 0x40),frm_00);
    if (frm_02 == (EncFrmStatus *)0x0) {
      frm_01->val = 0;
    }
    else {
      RVar5 = check_ref_cpb_pos((EncVirtualCpb *)((long)refs + 0x40),frm_02);
      if ((RVar5 < 0) &&
         (_mpp_log_l(2,"mpp_enc_refs","Assertion %s failed at %s:%d\n",(char *)0x0,"cpb_idx >= 0",
                     "mpp_enc_refs_get_cpb",0x3a7), (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      *(EncFrmStatus *)((long)refs + 0x5a0) = *frm_01;
      *frm_01 = *frm_02;
    }
    if ((uVar2 >> 2 & 1) != 0) {
      frm_00->val = frm_00->val & 0xfffffffffffffff7 | 8;
    }
    if ((enc_refs_debug & 4) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","frm status:\n","mpp_enc_refs_get_cpb");
      _dump_frm(frm_00,"mpp_enc_refs_get_cpb",0x3b3);
      _mpp_log_l(4,"mpp_enc_refs","ref status:\n","mpp_enc_refs_get_cpb");
      _dump_frm(frm_01,"mpp_enc_refs_get_cpb",0x3b5);
    }
    memset(status->init,0,0x40);
    save_cpb_status((EncVirtualCpb *)((long)refs + 0x40),status->init);
    store_ref_to_cpb((EncVirtualCpb *)((long)refs + 0x40),frm_00);
    memset(status->final,0,0x40);
    save_cpb_status((EncVirtualCpb *)((long)refs + 0x40),status->final);
    if ((enc_refs_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","leave %p\n","mpp_enc_refs_get_cpb",refs);
    }
    refs_local._4_4_ = MPP_OK;
  }
  return refs_local._4_4_;
}

Assistant:

MPP_RET mpp_enc_refs_get_cpb(MppEncRefs refs, EncCpbStatus *status)
{
    if (NULL == refs) {
        mpp_err_f("invalid NULL input refs\n");
        return MPP_ERR_VALUE;
    }

    enc_refs_dbg_func("enter %p\n", refs);

    MppEncRefsImpl *p = (MppEncRefsImpl *)refs;
    MppEncRefCfgImpl *cfg = p->ref_cfg;
    EncVirtualCpb *cpb = &p->cpb;
    MppEncRefStFrmCfg *st_cfg = NULL;
    MppEncRefFrmUsrCfg *usr_cfg = &p->usr_cfg;
    EncFrmStatus *frm = &status->curr;
    EncFrmStatus *ref = &status->refr;
    RefsCnt *lt_cfg = cpb->lt_cnter;
    RK_S32 set_to_lt = 0;
    RK_S32 cleanup_cpb = 0;
    RK_S32 prev_frm_is_pass1 = frm->save_pass1;
    RK_S32 i;

    /* step 1. check igop from cfg_set and force idr for usr_cfg */
    if (p->changed & ENC_REFS_IGOP_CHANGED)
        cleanup_cpb = 1;

    if (p->igop && (cpb->seq_idx >= p->igop)) {
        if (p->refresh_length) {
            p->cpb.seq_cnt = cpb->seq_idx / p->igop + 1;
        } else
            cleanup_cpb = 1;
    }

    if (usr_cfg->force_flag & ENC_FORCE_IDR) {
        usr_cfg->force_flag &= (~ENC_FORCE_IDR);
        cleanup_cpb = 1;
        p->cpb.seq_cnt = 0;
    }

    if (cleanup_cpb) {
        /* update seq_idx for igop loop and force idr */
        cleanup_cpb_refs(cpb);
    } else if (p->changed & ENC_REFS_REF_CFG_CHANGED) {
        cpb->st_cfg_pos = 0;
        cpb->st_cfg_repeat_pos = 0;
    }

    p->changed = 0;

    cpb->frm_idx++;
    cpb->st_cfg_pos = get_cpb_st_cfg_pos(cpb, cfg);
    st_cfg = &cfg->st_cfg[cpb->st_cfg_pos];
    /* step 2. updated by st_cfg */
    set_st_cfg_to_frm(frm, cpb->seq_idx++, st_cfg);
    set_frm_refresh_flag(frm, p);

    lt_cfg = p->cpb.lt_cnter;

    /* step 3. updated by lt_cfg */
    for (i = 0; i < cfg->lt_cfg_cnt; i++, lt_cfg++) {
        if (lt_cfg->delay_cnt) {
            lt_cfg->delay_cnt--;
            continue;
        }

        if (!set_to_lt) {
            if (!lt_cfg->cnt) {
                set_lt_cfg_to_frm(frm, lt_cfg);
                set_to_lt = 1;
            }
        }

        lt_cfg->cnt++;
        if (lt_cfg->cnt >= lt_cfg->len) {
            if (lt_cfg->len) {
                /* when there is loop len loop lt_cfg */
                lt_cfg->cnt = 0;
                lt_cfg->idx++;
            } else {
                /* else just set lt_cfg once */
                lt_cfg->cnt = 1;
                lt_cfg->idx = 1;
            }
        }
    }

    /* step 4. process force flags and force ref_mode */
    if (usr_cfg->force_flag & ENC_FORCE_LT_REF_IDX) {
        frm->is_non_ref = 0;
        frm->is_lt_ref = 1;
        frm->lt_idx = usr_cfg->force_lt_idx;
        if (frm->is_idr && frm->lt_idx) {
            frm->lt_idx = 0;
            mpp_err_f("can not set IDR to ltr with non-zero index\n");
        }
        /* lt_ref will be forced to tid 0 */
        frm->temporal_id = 0;

        /* reset st_cfg to next loop */
        cpb->st_cfg_repeat_pos = 0;
        cpb->st_cfg_pos = 0;
        usr_cfg->force_flag &= ~ENC_FORCE_LT_REF_IDX;
    }

    if (usr_cfg->force_flag & ENC_FORCE_TEMPORAL_ID) {
        if (usr_cfg->force_temporal_id >= cfg->max_tlayers ||
            frm->is_idr || frm->is_lt_ref)
            mpp_err_f("Invalid temporal_id %d, frm is %s\n", usr_cfg->force_temporal_id,
                      frm->is_idr ? "IDR" : (frm->is_lt_ref ? "LTR" : "st"));
        else
            frm->temporal_id = usr_cfg->force_temporal_id;

        usr_cfg->force_flag &= ~ENC_FORCE_TEMPORAL_ID;
    }

    if (usr_cfg->force_flag & ENC_FORCE_REF_MODE) {
        frm->ref_mode = usr_cfg->force_ref_mode;
        frm->ref_arg = usr_cfg->force_ref_arg;

        usr_cfg->force_flag &= ~ENC_FORCE_REF_MODE;
    }

    if (usr_cfg->force_flag & ENC_FORCE_PSKIP_NON_REF) {
        frm->is_non_ref = 1;

        usr_cfg->force_flag &= ~ENC_FORCE_PSKIP_NON_REF;
    }

    if (usr_cfg->force_flag & ENC_FORCE_PSKIP_IS_REF) {
        frm->force_pskip_is_ref = 1;

        usr_cfg->force_flag &= ~ENC_FORCE_PSKIP_IS_REF;
    }

    frm->non_recn = frm->is_non_ref || (p->igop == 1);

    /* update st_cfg for st_cfg loop */
    cpb->st_cfg_repeat_pos++;
    if (cpb->st_cfg_repeat_pos > st_cfg->repeat) {
        cpb->st_cfg_repeat_pos = 0;
        cpb->st_cfg_pos++;
    }

    /* step 4. try find ref by the ref_mode */
    EncFrmStatus *ref_found = get_ref_from_cpb(&p->cpb, frm);
    if (ref_found) {
        RK_S32 cpb_idx = check_ref_cpb_pos(&p->cpb, ref_found);

        mpp_assert(cpb_idx >= 0);
        cpb->list0[0].val = ref->val;
        ref->val = ref_found->val;
    } else
        ref->val = 0;

    /* step 5. check use previous pass one frame as input */
    if (prev_frm_is_pass1)
        frm->use_pass1 = 1;

    if (enc_refs_debug & MPP_ENC_REFS_DBG_FRM) {
        mpp_log_f("frm status:\n");
        dump_frm(frm);
        mpp_log_f("ref status:\n");
        dump_frm(ref);
    }

    /* step 5. generate cpb init */
    memset(status->init, 0, sizeof(status->init));
    save_cpb_status(&p->cpb, status->init);
    // TODO: cpb_init must be the same to cpb_final

    /* step 6. store frame according to status */
    store_ref_to_cpb(&p->cpb, frm);

    /* step 7. generate cpb final */
    memset(status->final, 0, sizeof(status->final));
    save_cpb_status(&p->cpb, status->final);

    enc_refs_dbg_func("leave %p\n", refs);
    return MPP_OK;
}